

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_opc_mxu__pool19(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  TCGContext_conflict4 *s;
  uint uVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a1_01;
  TCGTemp *a1_02;
  TCGTemp *a3;
  TCGTemp *a3_00;
  TCGTemp *a3_01;
  TCGTemp *a1_03;
  TCGv_i32 ret;
  uintptr_t o;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o_2;
  TCGOpcode TVar5;
  TCGv_i32 ret_00;
  uint uVar6;
  uintptr_t o_7;
  TCGv_i32 arg;
  uintptr_t o_5;
  
  if ((*(byte *)((long)(env->active_tc).gpr + 0x2a) & 0x80) != 0) {
    generate_exception_err((DisasContext_conflict4 *)env,0x14,0);
    return;
  }
  s = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
  a1 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  a1_00 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  a1_01 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  a1_02 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  arg = (TCGv_i32)((long)a1_02 - (long)s);
  a3 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  a3_00 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  a3_01 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  a1_03 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  uVar2 = (env->active_tc).gpr[10];
  uVar6 = uVar2 >> 0xe & 0xf;
  uVar1 = uVar2 >> 10 & 0xf;
  if (uVar1 == 0) {
    TVar5 = INDEX_op_movi_i32;
    pTVar3 = (TCGv_i32)0x0;
LAB_00846514:
    tcg_gen_op2_mipsel(s,TVar5,(TCGArg)a1_02,(TCGArg)pTVar3);
  }
  else if (s->mxu_gpr[uVar1 - 1] != arg) {
    pTVar3 = s->mxu_gpr[uVar1 - 1] + (long)s;
    TVar5 = INDEX_op_mov_i32;
    goto LAB_00846514;
  }
  pTVar3 = (TCGv_i32)((long)a1_03 - (long)s);
  if (uVar6 == 0) {
    TVar5 = INDEX_op_movi_i32;
    pTVar4 = (TCGv_i32)0x0;
  }
  else {
    if (s->mxu_gpr[uVar6 - 1] == pTVar3) goto LAB_0084656f;
    pTVar4 = s->mxu_gpr[uVar6 - 1] + (long)s;
    TVar5 = INDEX_op_mov_i32;
  }
  tcg_gen_op2_mipsel(s,TVar5,(TCGArg)a1_03,(TCGArg)pTVar4);
LAB_0084656f:
  ret_00 = (TCGv_i32)((long)a1 - (long)s);
  pTVar4 = (TCGv_i32)((long)a1_00 - (long)s);
  ret = (TCGv_i32)((long)a1_01 - (long)s);
  if ((uVar2 & 0xc00000) == 0x800000) {
    tcg_gen_ext8s_i32_mipsel(s,ret_00,arg);
    tcg_gen_shri_i32_mipsel(s,arg,arg,8);
    tcg_gen_ext8s_i32_mipsel(s,pTVar4,arg);
    tcg_gen_shri_i32_mipsel(s,arg,arg,8);
    tcg_gen_ext8s_i32_mipsel(s,ret,arg);
    tcg_gen_shri_i32_mipsel(s,arg,arg,8);
    tcg_gen_ext8s_i32_mipsel(s,arg,arg);
  }
  else {
    tcg_gen_ext8u_i32_mipsel(s,ret_00,arg);
    tcg_gen_shri_i32_mipsel(s,arg,arg,8);
    tcg_gen_ext8u_i32_mipsel(s,pTVar4,arg);
    tcg_gen_shri_i32_mipsel(s,arg,arg,8);
    tcg_gen_ext8u_i32_mipsel(s,ret,arg);
    tcg_gen_shri_i32_mipsel(s,arg,arg,8);
    tcg_gen_ext8u_i32_mipsel(s,arg,arg);
  }
  tcg_gen_ext8u_i32_mipsel(s,(TCGv_i32)((long)a3 - (long)s),pTVar3);
  tcg_gen_shri_i32_mipsel(s,pTVar3,pTVar3,8);
  tcg_gen_ext8u_i32_mipsel(s,(TCGv_i32)((long)a3_00 - (long)s),pTVar3);
  tcg_gen_shri_i32_mipsel(s,pTVar3,pTVar3,8);
  tcg_gen_ext8u_i32_mipsel(s,(TCGv_i32)((long)a3_01 - (long)s),pTVar3);
  tcg_gen_shri_i32_mipsel(s,pTVar3,pTVar3,8);
  tcg_gen_ext8u_i32_mipsel(s,pTVar3,pTVar3);
  tcg_gen_op3_mipsel(s,INDEX_op_mul_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
  tcg_gen_op3_mipsel(s,INDEX_op_mul_i32,(TCGArg)a1_00,(TCGArg)a1_00,(TCGArg)a3_00);
  tcg_gen_op3_mipsel(s,INDEX_op_mul_i32,(TCGArg)a1_01,(TCGArg)a1_01,(TCGArg)a3_01);
  tcg_gen_op3_mipsel(s,INDEX_op_mul_i32,(TCGArg)a1_02,(TCGArg)a1_02,(TCGArg)a1_03);
  tcg_gen_andi_i32_mipsel(s,ret_00,ret_00,0xffff);
  tcg_gen_andi_i32_mipsel(s,pTVar4,pTVar4,0xffff);
  tcg_gen_andi_i32_mipsel(s,ret,ret,0xffff);
  tcg_gen_andi_i32_mipsel(s,arg,arg,0xffff);
  tcg_gen_shli_i32_mipsel(s,pTVar4,pTVar4,0x10);
  tcg_gen_shli_i32_mipsel(s,arg,arg,0x10);
  tcg_gen_op3_mipsel(s,INDEX_op_or_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)a1_00);
  tcg_gen_op3_mipsel(s,INDEX_op_or_i32,(TCGArg)a1_00,(TCGArg)a1_01,(TCGArg)a1_02);
  uVar1 = (uVar2 >> 0x12 & 0xf) - 1;
  if ((uVar1 < 0xf) && (s->mxu_gpr[uVar1] != ret_00)) {
    tcg_gen_op2_mipsel(s,INDEX_op_mov_i32,(TCGArg)(s->mxu_gpr[uVar1] + (long)s),(TCGArg)a1);
  }
  uVar2 = (uVar2 >> 6 & 0xf) - 1;
  if ((uVar2 < 0xf) && (s->mxu_gpr[uVar2] != pTVar4)) {
    tcg_gen_op2_mipsel(s,INDEX_op_mov_i32,(TCGArg)(s->mxu_gpr[uVar2] + (long)s),(TCGArg)a1_00);
  }
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)(pTVar4 + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)(arg + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)((TCGv_i32)((long)a3 - (long)s) + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)((TCGv_i32)((long)a3_00 - (long)s) + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)((TCGv_i32)((long)a3_01 - (long)s) + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)(pTVar3 + (long)s));
  return;
}

Assistant:

static void decode_opc_mxu__pool19(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opcode = extract32(ctx->opcode, 22, 2);

    switch (opcode) {
    case OPC_MXU_Q8MUL:
    case OPC_MXU_Q8MULSU:
        gen_mxu_q8mul_q8mulsu(ctx);
        break;
    default:
        MIPS_INVAL("decode_opc_mxu");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}